

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O2

QList<QString> * __thiscall
QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>
::keys(QList<QString> *__return_storage_ptr__,
      QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>
      *this)

{
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QList<QString>::reserve
            (__return_storage_ptr__,(this->m)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  transform<std::_Rb_tree_const_iterator<std::pair<QString_const,QString>>,std::back_insert_iterator<QList<QString>>,QMapData<std::map<QString,QString,std::less<QString>,std::allocator<std::pair<QString_const,QString>>>>::keys()const::_lambda(auto:1_const&)_1_>
            ((this->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             &(this->m)._M_t._M_impl.super__Rb_tree_header,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

QList<Key> keys() const
    {
        QList<Key> result;
        result.reserve(m.size());

        const auto extractKey = [](const auto &v) { return v.first; };

        std::transform(m.cbegin(),
                       m.cend(),
                       std::back_inserter(result),
                       extractKey);
        return result;
    }